

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_float_vector(exr_context_t ctxt,exr_attribute_t *a)

{
  void *__dest;
  exr_context_t in_RSI;
  long in_RDI;
  float *tmp;
  exr_result_t rv;
  void *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  exr_result_t local_4;
  
  local_4 = save_attr_sz(in_RSI,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((local_4 == 0) && (0 < **(int **)&in_RSI->tmp_filename)) {
    if (*(int *)(*(long *)&in_RSI->tmp_filename + 4) < 1) {
      __dest = (void *)(**(code **)(in_RDI + 0x58))((long)**(int **)&in_RSI->tmp_filename << 2);
      if (__dest == (void *)0x0) {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
      }
      else {
        memcpy(__dest,*(void **)(*(long *)&in_RSI->tmp_filename + 8),
               (long)**(int **)&in_RSI->tmp_filename << 2);
        local_4 = save_attr_32((exr_context_t)CONCAT44(local_4,in_stack_ffffffffffffffe0),__dest,0);
        (**(code **)(in_RDI + 0x60))(__dest);
      }
    }
    else {
      local_4 = save_attr_32((exr_context_t)(ulong)in_stack_ffffffffffffffe0,
                             in_stack_ffffffffffffffd8,0);
      priv_to_native32(*(void **)(*(long *)&in_RSI->tmp_filename + 8),
                       **(int **)&in_RSI->tmp_filename);
    }
  }
  return local_4;
}

Assistant:

static exr_result_t
save_float_vector (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;

    rv =
        save_attr_sz (ctxt, sizeof (float) * (size_t) (a->floatvector->length));
    if (rv == EXR_ERR_SUCCESS && a->floatvector->length > 0)
    {
        if (a->floatvector->alloc_size > 0)
        {
            /* we own the data, so we can swap it, then swap it back */
            rv = save_attr_32 (
                ctxt,
                EXR_CONST_CAST (void*, a->floatvector->arr),
                a->floatvector->length);
            priv_to_native32 (
                EXR_CONST_CAST (void*, a->floatvector->arr),
                a->floatvector->length);
        }
        else
        {
            /* might be static data, take a copy first */
            float* tmp = ctxt->alloc_fn (
                (size_t) (a->floatvector->length) * sizeof (float));
            if (tmp == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
            memcpy (
                tmp,
                a->floatvector->arr,
                (size_t) (a->floatvector->length) * sizeof (float));
            rv = save_attr_32 (ctxt, tmp, a->floatvector->length);
            ctxt->free_fn (tmp);
        }
    }

    return rv;
}